

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Random.cpp
# Opt level: O0

void amrex::DeallocateRandomSeedDevArray(void)

{
  return;
}

Assistant:

void
amrex::DeallocateRandomSeedDevArray ()
{
#ifdef AMREX_USE_GPU
#ifdef AMREX_USE_DPCPP
    if (rand_engine_descr) {
        delete rand_engine_descr;
        Gpu::streamSynchronize();
        rand_engine_descr = nullptr;
    }
#else
    if (gpu_rand_state != nullptr)
    {
        The_Arena()->free(gpu_rand_state);
        gpu_rand_state = nullptr;
    }
#endif
#endif
}